

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

int mbedtls_gcm_self_test(int verbose)

{
  uchar (*input) [64];
  size_t length;
  size_t iv_len;
  size_t add_len;
  int iVar1;
  int iVar2;
  long lVar3;
  uint keybits;
  uchar (*iv) [64];
  uchar (*key) [32];
  uchar (*add) [64];
  long lVar4;
  uchar (*input_00) [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong local_290;
  uchar (*local_280) [16];
  uchar tag_buf [16];
  uchar (*local_240) [64];
  uchar (*local_238) [16];
  long local_228;
  uchar buf [64];
  mbedtls_gcm_context ctx;
  
  memset(&ctx,0,0x1a0);
  local_238 = tag;
  local_240 = ct;
  lVar3 = 0;
  do {
    if (lVar3 == 3) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
    keybits = (int)lVar3 * 0x40 + 0x80;
    local_280 = local_238;
    local_228 = 0;
    local_290 = 0;
    input_00 = local_240;
    for (lVar4 = -0x18; lVar4 != 0; lVar4 = lVar4 + 4) {
      if (verbose != 0) {
        printf("  AES-GCM-%3d #%d (%s): ",(ulong)keybits,local_290,"enc");
      }
      iVar2 = *(int *)(&UNK_00157b28 + lVar4);
      key = ::key + iVar2;
      mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      length = *(size_t *)((long)pt_len + local_228);
      iv = ::iv + *(int *)(&UNK_00157908 + lVar4);
      iv_len = *(size_t *)((long)::iv_len + local_228);
      add = additional + *(int *)(&UNK_00157958 + lVar4);
      add_len = *(size_t *)((long)::add_len + local_228);
      input = pt + iVar2;
      iVar1 = mbedtls_gcm_crypt_and_tag
                        (&ctx,1,length,*iv,iv_len,*add,add_len,*input,buf,0x10,tag_buf);
      if (((iVar1 != 0) || (iVar1 = bcmp(buf,input_00,length), iVar1 != 0)) ||
         (auVar5[0] = -((*local_280)[0] == tag_buf[0]), auVar5[1] = -((*local_280)[1] == tag_buf[1])
         , auVar5[2] = -((*local_280)[2] == tag_buf[2]),
         auVar5[3] = -((*local_280)[3] == tag_buf[3]), auVar5[4] = -((*local_280)[4] == tag_buf[4]),
         auVar5[5] = -((*local_280)[5] == tag_buf[5]), auVar5[6] = -((*local_280)[6] == tag_buf[6]),
         auVar5[7] = -((*local_280)[7] == tag_buf[7]), auVar5[8] = -((*local_280)[8] == tag_buf[8]),
         auVar5[9] = -((*local_280)[9] == tag_buf[9]),
         auVar5[10] = -((*local_280)[10] == tag_buf[10]),
         auVar5[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
         auVar5[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
         auVar5[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
         auVar5[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
         auVar5[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
         != 0xffff)) {
LAB_001363af:
        if (verbose != 0) {
          puts("failed");
          return 1;
        }
        return 1;
      }
      mbedtls_gcm_free(&ctx);
      if (verbose != 0) {
        puts("passed");
        printf("  AES-GCM-%3d #%d (%s): ",(ulong)keybits,local_290,"dec");
      }
      mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      iVar1 = mbedtls_gcm_crypt_and_tag
                        (&ctx,0,length,*iv,iv_len,*add,add_len,*input_00,buf,0x10,tag_buf);
      if (((iVar1 != 0) || (iVar1 = bcmp(buf,input,length), iVar1 != 0)) ||
         (auVar6[0] = -((*local_280)[0] == tag_buf[0]), auVar6[1] = -((*local_280)[1] == tag_buf[1])
         , auVar6[2] = -((*local_280)[2] == tag_buf[2]),
         auVar6[3] = -((*local_280)[3] == tag_buf[3]), auVar6[4] = -((*local_280)[4] == tag_buf[4]),
         auVar6[5] = -((*local_280)[5] == tag_buf[5]), auVar6[6] = -((*local_280)[6] == tag_buf[6]),
         auVar6[7] = -((*local_280)[7] == tag_buf[7]), auVar6[8] = -((*local_280)[8] == tag_buf[8]),
         auVar6[9] = -((*local_280)[9] == tag_buf[9]),
         auVar6[10] = -((*local_280)[10] == tag_buf[10]),
         auVar6[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
         auVar6[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
         auVar6[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
         auVar6[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
         auVar6[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf)
         != 0xffff)) goto LAB_001363af;
      mbedtls_gcm_free(&ctx);
      if (verbose != 0) {
        puts("passed");
        printf("  AES-GCM-%3d #%d split (%s): ",(ulong)keybits,local_290,"enc");
      }
      mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      iVar1 = mbedtls_gcm_starts(&ctx,1,*iv,iv_len,*add,add_len);
      if (iVar1 != 0) goto LAB_001363af;
      if (local_290 < 2) {
        iVar2 = mbedtls_gcm_update(&ctx,length,*input,buf);
      }
      else {
        iVar1 = mbedtls_gcm_update(&ctx,0x20,*input,buf);
        if (iVar1 != 0) goto LAB_001363af;
        iVar2 = mbedtls_gcm_update(&ctx,length - 0x20,pt[iVar2] + 0x20,buf + 0x20);
      }
      if (((iVar2 != 0) || (iVar2 = mbedtls_gcm_finish(&ctx,tag_buf,0x10), iVar2 != 0)) ||
         ((iVar2 = bcmp(buf,input_00,length), iVar2 != 0 ||
          (auVar7[0] = -((*local_280)[0] == tag_buf[0]),
          auVar7[1] = -((*local_280)[1] == tag_buf[1]), auVar7[2] = -((*local_280)[2] == tag_buf[2])
          , auVar7[3] = -((*local_280)[3] == tag_buf[3]),
          auVar7[4] = -((*local_280)[4] == tag_buf[4]), auVar7[5] = -((*local_280)[5] == tag_buf[5])
          , auVar7[6] = -((*local_280)[6] == tag_buf[6]),
          auVar7[7] = -((*local_280)[7] == tag_buf[7]), auVar7[8] = -((*local_280)[8] == tag_buf[8])
          , auVar7[9] = -((*local_280)[9] == tag_buf[9]),
          auVar7[10] = -((*local_280)[10] == tag_buf[10]),
          auVar7[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
          auVar7[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
          auVar7[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
          auVar7[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
          auVar7[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
          (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf
                  ) != 0xffff)))) goto LAB_001363af;
      mbedtls_gcm_free(&ctx);
      if (verbose != 0) {
        puts("passed");
        printf("  AES-GCM-%3d #%d split (%s): ",(ulong)keybits,local_290,"dec");
      }
      mbedtls_gcm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,*key,keybits);
      iVar2 = mbedtls_gcm_starts(&ctx,0,*iv,iv_len,*add,add_len);
      if (iVar2 != 0) goto LAB_001363af;
      if (local_290 < 2) {
        iVar2 = mbedtls_gcm_update(&ctx,length,*input_00,buf);
      }
      else {
        iVar2 = mbedtls_gcm_update(&ctx,0x20,*input_00,buf);
        if (iVar2 != 0) goto LAB_001363af;
        iVar2 = mbedtls_gcm_update(&ctx,length - 0x20,*input_00 + 0x20,buf + 0x20);
      }
      if ((((iVar2 != 0) || (iVar2 = mbedtls_gcm_finish(&ctx,tag_buf,0x10), iVar2 != 0)) ||
          (iVar2 = bcmp(buf,input,length), iVar2 != 0)) ||
         (auVar8[0] = -((*local_280)[0] == tag_buf[0]), auVar8[1] = -((*local_280)[1] == tag_buf[1])
         , auVar8[2] = -((*local_280)[2] == tag_buf[2]),
         auVar8[3] = -((*local_280)[3] == tag_buf[3]), auVar8[4] = -((*local_280)[4] == tag_buf[4]),
         auVar8[5] = -((*local_280)[5] == tag_buf[5]), auVar8[6] = -((*local_280)[6] == tag_buf[6]),
         auVar8[7] = -((*local_280)[7] == tag_buf[7]), auVar8[8] = -((*local_280)[8] == tag_buf[8]),
         auVar8[9] = -((*local_280)[9] == tag_buf[9]),
         auVar8[10] = -((*local_280)[10] == tag_buf[10]),
         auVar8[0xb] = -((*local_280)[0xb] == tag_buf[0xb]),
         auVar8[0xc] = -((*local_280)[0xc] == tag_buf[0xc]),
         auVar8[0xd] = -((*local_280)[0xd] == tag_buf[0xd]),
         auVar8[0xe] = -((*local_280)[0xe] == tag_buf[0xe]),
         auVar8[0xf] = -((*local_280)[0xf] == tag_buf[0xf]),
         (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
         != 0xffff)) goto LAB_001363af;
      mbedtls_gcm_free(&ctx);
      if (verbose != 0) {
        puts("passed");
      }
      local_290 = local_290 + 1;
      local_228 = local_228 + 8;
      local_280 = local_280 + 1;
      input_00 = input_00 + 1;
    }
    lVar3 = lVar3 + 1;
    local_238 = local_238 + 6;
    local_240 = local_240 + 6;
  } while( true );
}

Assistant:

int mbedtls_gcm_self_test( int verbose )
{
    mbedtls_gcm_context ctx;
    unsigned char buf[64];
    unsigned char tag_buf[16];
    int i, j, ret;
    mbedtls_cipher_id_t cipher = MBEDTLS_CIPHER_ID_AES;

    mbedtls_gcm_init( &ctx );

    for( j = 0; j < 3; j++ )
    {
        int key_len = 128 + 64 * j;

        for( i = 0; i < MAX_TESTS; i++ )
        {
            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                 key_len, i, "enc" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_ENCRYPT,
                                     pt_len[i],
                                     iv[iv_index[i]], iv_len[i],
                                     additional[add_index[i]], add_len[i],
                                     pt[pt_index[i]], buf, 16, tag_buf );

            if( ret != 0 ||
                memcmp( buf, ct[j * 6 + i], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d (%s): ",
                                 key_len, i, "dec" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_crypt_and_tag( &ctx, MBEDTLS_GCM_DECRYPT,
                                     pt_len[i],
                                     iv[iv_index[i]], iv_len[i],
                                     additional[add_index[i]], add_len[i],
                                     ct[j * 6 + i], buf, 16, tag_buf );

            if( ret != 0 ||
                memcmp( buf, pt[pt_index[i]], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                 key_len, i, "enc" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_ENCRYPT,
                              iv[iv_index[i]], iv_len[i],
                              additional[add_index[i]], add_len[i] );
            if( ret != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            if( pt_len[i] > 32 )
            {
                size_t rest_len = pt_len[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, pt[pt_index[i]], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }

                ret = mbedtls_gcm_update( &ctx, rest_len, pt[pt_index[i]] + 32,
                                  buf + 32 );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len[i], pt[pt_index[i]], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 ||
                memcmp( buf, ct[j * 6 + i], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

            if( verbose != 0 )
                mbedtls_printf( "  AES-GCM-%3d #%d split (%s): ",
                                 key_len, i, "dec" );

            mbedtls_gcm_setkey( &ctx, cipher, key[key_index[i]], key_len );

            ret = mbedtls_gcm_starts( &ctx, MBEDTLS_GCM_DECRYPT,
                              iv[iv_index[i]], iv_len[i],
                              additional[add_index[i]], add_len[i] );
            if( ret != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            if( pt_len[i] > 32 )
            {
                size_t rest_len = pt_len[i] - 32;
                ret = mbedtls_gcm_update( &ctx, 32, ct[j * 6 + i], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }

                ret = mbedtls_gcm_update( &ctx, rest_len, ct[j * 6 + i] + 32,
                                  buf + 32 );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }
            else
            {
                ret = mbedtls_gcm_update( &ctx, pt_len[i], ct[j * 6 + i], buf );
                if( ret != 0 )
                {
                    if( verbose != 0 )
                        mbedtls_printf( "failed\n" );

                    return( 1 );
                }
            }

            ret = mbedtls_gcm_finish( &ctx, tag_buf, 16 );
            if( ret != 0 ||
                memcmp( buf, pt[pt_index[i]], pt_len[i] ) != 0 ||
                memcmp( tag_buf, tag[j * 6 + i], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }

            mbedtls_gcm_free( &ctx );

            if( verbose != 0 )
                mbedtls_printf( "passed\n" );

        }
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}